

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O1

void supivoc(supcxdef *ctx)

{
  voccxdef *ctx_00;
  vocidef **ppvVar1;
  vocidef *pvVar2;
  int iVar3;
  long lVar4;
  vocidef ***pppvVar5;
  short sVar6;
  
  ctx_00 = ctx->supcxvoc;
  vocdelinh(ctx_00);
  pppvVar5 = ctx_00->voccxinh;
  sVar6 = 0;
  iVar3 = 0;
  do {
    ppvVar1 = *pppvVar5;
    if (ppvVar1 != (vocidef **)0x0) {
      lVar4 = 0;
      do {
        pvVar2 = ppvVar1[lVar4];
        if ((pvVar2 != (vocidef *)0x0) && (((pvVar2->vociu).vocius.vociusflg & 1) == 0)) {
          (pvVar2->vociu).vocius.vociusilc = 0xffff;
          supivoc1(ctx,ctx->supcxvoc,ppvVar1[lVar4],sVar6 + (short)lVar4,0,0);
        }
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 0x100);
    }
    pppvVar5 = pppvVar5 + 1;
    iVar3 = iVar3 + 1;
    sVar6 = sVar6 + 0x100;
  } while (iVar3 != 0x80);
  return;
}

Assistant:

void supivoc(supcxdef *ctx)
{
    vocidef ***vpg;
    vocidef  **v;
    voccxdef  *voc = ctx->supcxvoc;
    int        i;
    int        j;
    objnum     obj;
    
    /* delete all existing inherited words */
    vocdelinh(voc);
    
    for (vpg = voc->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;                     /* no entries on this page */
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            /* if it's not a class, inherit vocabulary for the object */
            if (!*v) continue;
            if (!((*v)->vociflg & VOCIFCLASS))
            {
                (*v)->vociilc = MCMONINV;      /* no inherited location yet */
                supivoc1(ctx, ctx->supcxvoc, *v, obj, FALSE, 0);
            }
        }
    }
}